

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

FT_UShort __thiscall
FreeTypeFaceWrapper::GetInPDFMeasurements(FreeTypeFaceWrapper *this,FT_UShort inFontMeasurement)

{
  FT_UShort inFontMeasurement_local;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this_local._6_2_ = 0;
  }
  else {
    this_local._6_2_ = inFontMeasurement;
    if (this->mFace->units_per_EM != 1000) {
      this_local._6_2_ =
           (FT_UShort)
           (int)(((double)inFontMeasurement * 1000.0) / (double)this->mFace->units_per_EM);
    }
  }
  return this_local._6_2_;
}

Assistant:

FT_UShort FreeTypeFaceWrapper::GetInPDFMeasurements(FT_UShort inFontMeasurement)
{
	if(mFace)
	{
		if(1000 == mFace->units_per_EM)
			return inFontMeasurement;
		else
			return FT_UShort((double)inFontMeasurement * 1000.0 / mFace->units_per_EM);
	}
	else
		return 0;
}